

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O1

maybe<pstore::uuid,_void> *
pstore::uuid::from_string(maybe<pstore::uuid,_void> *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte bVar7;
  container_type data;
  undefined8 local_10;
  undefined8 uStack_8;
  
  if (str->_M_string_length == 0x24) {
    pcVar1 = (str->_M_dataplus)._M_p;
    bVar2 = true;
    lVar4 = 0;
    pbVar5 = (byte *)&local_10;
    do {
      bVar7 = pcVar1[lVar4];
      pbVar6 = pbVar5;
      if (((uint)lVar4 < 0x18) && ((0x842100U >> ((uint)lVar4 & 0x1f) & 1) != 0)) {
        if (bVar7 != 0x2d) goto LAB_0011450a;
        if (!bVar2) {
          assert_failed("out.is_high ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/uuid.cpp"
                        ,0x9b);
        }
      }
      else {
        if ((byte)(bVar7 + 0x9f) < 6) {
          cVar3 = -0x57;
LAB_001144c1:
          bVar7 = bVar7 + cVar3;
          if (bVar2) goto LAB_001144d7;
LAB_001144e4:
          bVar7 = bVar7 | *pbVar5;
          pbVar6 = pbVar5 + 1;
        }
        else {
          if ((byte)(bVar7 + 0xbf) < 6) {
            cVar3 = -0x37;
            goto LAB_001144c1;
          }
          if (9 < (byte)(bVar7 - 0x30)) goto LAB_0011450a;
          if (!bVar2) {
            bVar7 = bVar7 - 0x30;
            goto LAB_001144e4;
          }
LAB_001144d7:
          bVar7 = bVar7 << 4;
        }
        *pbVar5 = bVar7;
        bVar2 = (bool)(bVar2 ^ 1);
      }
      lVar4 = lVar4 + 1;
      pbVar5 = pbVar6;
    } while (lVar4 != 0x24);
    *(undefined8 *)&__return_storage_ptr__->storage_ = local_10;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 8) = uStack_8;
    __return_storage_ptr__->valid_ = true;
  }
  else {
LAB_0011450a:
    *(undefined8 *)__return_storage_ptr__ = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 7) = 0;
    (__return_storage_ptr__->storage_).__data[0xf] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<uuid> uuid::from_string (std::string const & str) {
        if (str.length () != string_length) {
            return nothing<uuid> ();
        }

        container_type data;
        auto out = make_hex_decoder (std::begin (data));
        auto count = 0U;
        for (auto const digit : str) {
            switch (count++) {
            case 8:
            case 13:
            case 18:
            case 23:
                if (digit != '-') {
                    return nothing<uuid> ();
                }
                PSTORE_ASSERT (out.is_high ());
                break;
            default:
                if (digit >= 'a' && digit <= 'f') {
                    out.append (static_cast<unsigned> (digit) - ('a' - 10));
                } else if (digit >= 'A' && digit <= 'F') {
                    out.append (static_cast<unsigned> (digit) - ('A' - 10));
                } else if (digit >= '0' && digit <= '9') {
                    out.append (static_cast<unsigned> (digit) - '0');
                } else {
                    return nothing<uuid> ();
                }
                break;
            }
        }

        return just (uuid{data});
    }